

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O0

string * helics::generateInterfaceQueryResults
                   (string_view request,HandleManager *handles,GlobalFederateId fed,
                   function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                   *addHeaderInfo)

{
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  bool bVar1;
  reference this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  BasicHandleInfo *in_RDI;
  BaseType in_R8D;
  json base_5;
  BasicHandleInfo *handle_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  HandleManager *__range2_4;
  json base_4;
  BasicHandleInfo *handle_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  HandleManager *__range2_3;
  json base_3;
  BasicHandleInfo *handle_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  HandleManager *__range2_2;
  json base_2;
  BasicHandleInfo *handle_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  HandleManager *__range2_1;
  json base_1;
  BasicHandleInfo *handle;
  const_iterator __end2;
  const_iterator __begin2;
  HandleManager *__range2;
  json base;
  HandleManager *in_stack_fffffffffffffa98;
  _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
  *in_stack_fffffffffffffaa0;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *this_00;
  reference in_stack_fffffffffffffaa8;
  undefined6 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab6;
  undefined1 in_stack_fffffffffffffab7;
  size_type in_stack_fffffffffffffab8;
  GlobalFederateId *in_stack_fffffffffffffac0;
  HandleManager *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffae8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffaf0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_01;
  undefined8 in_stack_fffffffffffffb60;
  json *in_stack_fffffffffffffb68;
  BasicHandleInfo *block;
  undefined8 in_stack_fffffffffffffb80;
  _Self local_440;
  _Self local_420;
  undefined8 local_400;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_3f8 [4];
  undefined8 local_3b8;
  undefined8 local_3b0;
  BaseType local_3a8;
  undefined8 local_390;
  undefined8 local_388;
  BaseType local_37c;
  reference local_378;
  _Self local_370;
  _Self local_350;
  undefined8 local_330;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_328 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_308 [2];
  undefined8 local_2e8;
  undefined8 local_2e0;
  BaseType local_2d8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  BaseType local_2ac;
  reference local_2a8;
  _Self local_2a0;
  _Self local_280;
  undefined8 local_260;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_258 [4];
  undefined8 local_218;
  undefined8 local_210;
  BaseType local_208;
  undefined8 local_1f0;
  undefined8 local_1e8;
  BaseType local_1dc;
  reference local_1d8;
  _Self local_1d0;
  _Self local_1b0;
  undefined8 local_190;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_188 [4];
  undefined8 local_148;
  undefined8 local_140;
  BaseType local_138;
  undefined8 local_120;
  undefined8 local_118;
  BaseType local_10c;
  reference local_108;
  _Self local_100;
  _Self local_e0;
  undefined8 local_c0;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_b8 [5];
  undefined8 local_68;
  undefined8 local_60;
  BaseType local_58;
  undefined8 local_28;
  GlobalFederateId local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  block = in_RDI;
  local_28 = in_RCX;
  local_1c.gid = in_R8D;
  local_18 = in_RSI;
  local_10 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffab7,
                      CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
             (char *)in_stack_fffffffffffffaa8);
  __x._M_str = in_stack_fffffffffffffad0;
  __x._M_len = (size_t)in_stack_fffffffffffffac8;
  __y._M_str = (char *)in_stack_fffffffffffffac0;
  __y._M_len = in_stack_fffffffffffffab8;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_58 = local_1c.gid;
    generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__0,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__1>
              (in_RDI,local_28,local_1c.gid);
  }
  else {
    local_68 = local_18;
    local_60 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffab7,
                        CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
               (char *)in_stack_fffffffffffffaa8);
    __x_00._M_str = in_stack_fffffffffffffad0;
    __x_00._M_len = (size_t)in_stack_fffffffffffffac8;
    __y_00._M_str = (char *)in_stack_fffffffffffffac0;
    __y_00._M_len = in_stack_fffffffffffffab8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      std::
      function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
      ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                    *)in_stack_fffffffffffffaa0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffa98);
      std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_b8);
      init._M_array._6_1_ = in_stack_fffffffffffffab6;
      init._M_array._0_6_ = in_stack_fffffffffffffab0;
      init._M_array._7_1_ = in_stack_fffffffffffffab7;
      init._M_len = in_stack_fffffffffffffab8;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT17(in_stack_fffffffffffffab7,
                              CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffaa8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffaa0);
      local_c0 = local_28;
      HandleManager::begin(in_stack_fffffffffffffa98);
      HandleManager::end(in_stack_fffffffffffffa98);
      while (bVar1 = CLI::std::operator==(&local_e0,&local_100), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_108 = CLI::std::
                    _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                    ::operator*(&local_e0);
        bVar1 = GlobalFederateId::isValid(&local_1c);
        if (bVar1) {
          local_10c = local_1c.gid;
          bVar1 = GlobalFederateId::operator==((GlobalFederateId *)local_108,local_1c);
          if (bVar1) goto LAB_00697cb1;
        }
        else {
LAB_00697cb1:
          if (((local_108->handleType == INPUT) || (local_108->handleType == TRANSLATOR)) &&
             (bVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x697ce2), !bVar1)) {
            GlobalFederateId::isValid(&local_1c);
            storeInput((BasicHandleInfo *)in_stack_fffffffffffffb80,(json *)block,
                       SUB81((ulong)in_RDI >> 0x38,0));
          }
        }
        CLI::std::
        _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
        ::operator++(in_stack_fffffffffffffaa0);
      }
      fileops::generateJsonString
                ((json *)in_stack_fffffffffffffaa8,SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0)
                );
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffaa0);
    }
    else {
      local_120 = local_18;
      local_118 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffab7,
                          CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                 (char *)in_stack_fffffffffffffaa8);
      __x_01._M_str = in_stack_fffffffffffffad0;
      __x_01._M_len = (size_t)in_stack_fffffffffffffac8;
      __y_01._M_str = (char *)in_stack_fffffffffffffac0;
      __y_01._M_len = in_stack_fffffffffffffab8;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        local_138 = local_1c.gid;
        generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__2,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__3>
                  (in_RDI,local_28,local_1c.gid);
      }
      else {
        local_148 = local_18;
        local_140 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffab7,
                            CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                   (char *)in_stack_fffffffffffffaa8);
        __x_02._M_str = in_stack_fffffffffffffad0;
        __x_02._M_len = (size_t)in_stack_fffffffffffffac8;
        __y_02._M_str = (char *)in_stack_fffffffffffffac0;
        __y_02._M_len = in_stack_fffffffffffffab8;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          std::
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                        *)in_stack_fffffffffffffaa0,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffa98);
          std::
          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
          ::initializer_list(local_188);
          init_00._M_array._6_1_ = in_stack_fffffffffffffab6;
          init_00._M_array._0_6_ = in_stack_fffffffffffffab0;
          init_00._M_array._7_1_ = in_stack_fffffffffffffab7;
          init_00._M_len = in_stack_fffffffffffffab8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_00);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT17(in_stack_fffffffffffffab7,
                                  CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffaa8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffaa0);
          local_190 = local_28;
          HandleManager::begin(in_stack_fffffffffffffa98);
          HandleManager::end(in_stack_fffffffffffffa98);
          while (bVar1 = CLI::std::operator==(&local_1b0,&local_1d0), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_1d8 = CLI::std::
                        _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                        ::operator*(&local_1b0);
            bVar1 = GlobalFederateId::isValid(&local_1c);
            if (bVar1) {
              local_1dc = local_1c.gid;
              bVar1 = GlobalFederateId::operator==((GlobalFederateId *)local_1d8,local_1c);
              if (bVar1) goto LAB_0069801c;
            }
            else {
LAB_0069801c:
              if (((local_1d8->handleType == PUBLICATION) || (local_1d8->handleType == TRANSLATOR))
                 && (bVar1 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x69804d), !bVar1)) {
                GlobalFederateId::isValid(&local_1c);
                storePublication((BasicHandleInfo *)in_stack_fffffffffffffb80,(json *)block,
                                 SUB81((ulong)in_RDI >> 0x38,0));
              }
            }
            CLI::std::
            _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
            ::operator++(in_stack_fffffffffffffaa0);
          }
          fileops::generateJsonString
                    ((json *)in_stack_fffffffffffffaa8,
                     SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffaa0);
        }
        else {
          local_1f0 = local_18;
          local_1e8 = local_10;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffab7,
                              CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                     (char *)in_stack_fffffffffffffaa8);
          __x_03._M_str = in_stack_fffffffffffffad0;
          __x_03._M_len = (size_t)in_stack_fffffffffffffac8;
          __y_03._M_str = (char *)in_stack_fffffffffffffac0;
          __y_03._M_len = in_stack_fffffffffffffab8;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            local_208 = local_1c.gid;
            generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__4,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__5>
                      (in_RDI,local_28,local_1c.gid);
          }
          else {
            local_218 = local_18;
            local_210 = local_10;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffab7,
                                CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                       (char *)in_stack_fffffffffffffaa8);
            __x_04._M_str = in_stack_fffffffffffffad0;
            __x_04._M_len = (size_t)in_stack_fffffffffffffac8;
            __y_04._M_str = (char *)in_stack_fffffffffffffac0;
            __y_04._M_len = in_stack_fffffffffffffab8;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                            *)in_stack_fffffffffffffaa0,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffa98);
              std::
              initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              ::initializer_list(local_258);
              init_01._M_array._6_1_ = in_stack_fffffffffffffab6;
              init_01._M_array._0_6_ = in_stack_fffffffffffffab0;
              init_01._M_array._7_1_ = in_stack_fffffffffffffab7;
              init_01._M_len = in_stack_fffffffffffffab8;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::array(init_01);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT17(in_stack_fffffffffffffab7,
                                      CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0))
                          ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffaa8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffaa0);
              local_260 = local_28;
              HandleManager::begin(in_stack_fffffffffffffa98);
              HandleManager::end(in_stack_fffffffffffffa98);
              while (bVar1 = CLI::std::operator==(&local_280,&local_2a0), ((bVar1 ^ 0xffU) & 1) != 0
                    ) {
                local_2a8 = CLI::std::
                            _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                            ::operator*(&local_280);
                bVar1 = GlobalFederateId::isValid(&local_1c);
                if (bVar1) {
                  local_2ac = local_1c.gid;
                  bVar1 = GlobalFederateId::operator==((GlobalFederateId *)local_2a8,local_1c);
                  if (bVar1) goto LAB_00698375;
                }
                else {
LAB_00698375:
                  if ((local_2a8->handleType == FILTER) &&
                     (bVar1 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x698398), !bVar1)) {
                    GlobalFederateId::isValid(&local_1c);
                    storeFilter((BasicHandleInfo *)in_stack_fffffffffffffb80,(json *)block,
                                SUB81((ulong)in_RDI >> 0x38,0));
                  }
                }
                CLI::std::
                _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                ::operator++(in_stack_fffffffffffffaa0);
              }
              fileops::generateJsonString
                        ((json *)in_stack_fffffffffffffaa8,
                         SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0));
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffaa0);
            }
            else {
              local_2c0 = local_18;
              local_2b8 = local_10;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffab7,
                                  CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                         (char *)in_stack_fffffffffffffaa8);
              __x_05._M_str = in_stack_fffffffffffffad0;
              __x_05._M_len = (size_t)in_stack_fffffffffffffac8;
              __y_05._M_str = (char *)in_stack_fffffffffffffac0;
              __y_05._M_len = in_stack_fffffffffffffab8;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                local_2d8 = local_1c.gid;
                generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__6,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__7>
                          (in_RDI,local_28,local_1c.gid);
              }
              else {
                local_2e8 = local_18;
                local_2e0 = local_10;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT17(in_stack_fffffffffffffab7,
                                    CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0)),
                           (char *)in_stack_fffffffffffffaa8);
                __x_06._M_str = in_stack_fffffffffffffad0;
                __x_06._M_len = (size_t)in_stack_fffffffffffffac8;
                __y_06._M_str = (char *)in_stack_fffffffffffffac0;
                __y_06._M_len = in_stack_fffffffffffffab8;
                bVar1 = std::operator==(__x_06,__y_06);
                if (bVar1) {
                  this_01 = local_308;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
                  std::
                  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                  ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                *)in_stack_fffffffffffffaa0,
                               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffffa98);
                  std::
                  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ::initializer_list(local_328);
                  init_02._M_array._6_1_ = in_stack_fffffffffffffab6;
                  init_02._M_array._0_6_ = in_stack_fffffffffffffab0;
                  init_02._M_array._7_1_ = in_stack_fffffffffffffab7;
                  init_02._M_len = in_stack_fffffffffffffab8;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::array(init_02);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(this_01,in_stack_fffffffffffffae8);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)CONCAT17(in_stack_fffffffffffffab7,
                                          CONCAT16(in_stack_fffffffffffffab6,
                                                   in_stack_fffffffffffffab0)),
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffffaa8);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffffaa0);
                  local_330 = local_28;
                  HandleManager::begin(in_stack_fffffffffffffa98);
                  HandleManager::end(in_stack_fffffffffffffa98);
                  while (bVar1 = CLI::std::operator==(&local_350,&local_370),
                        ((bVar1 ^ 0xffU) & 1) != 0) {
                    local_378 = CLI::std::
                                _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                                ::operator*(&local_350);
                    bVar1 = GlobalFederateId::isValid(&local_1c);
                    if (bVar1) {
                      local_37c = local_1c.gid;
                      bVar1 = GlobalFederateId::operator==((GlobalFederateId *)local_378,local_1c);
                      if (bVar1) goto LAB_006986aa;
                    }
                    else {
LAB_006986aa:
                      if ((local_378->handleType == TRANSLATOR) &&
                         (bVar1 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x6986cd), !bVar1)) {
                        GlobalFederateId::isValid(&local_1c);
                        storeTranslator((BasicHandleInfo *)in_stack_fffffffffffffb80,(json *)block,
                                        SUB81((ulong)in_RDI >> 0x38,0));
                      }
                    }
                    CLI::std::
                    _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                    ::operator++(in_stack_fffffffffffffaa0);
                  }
                  fileops::generateJsonString
                            ((json *)in_stack_fffffffffffffaa8,
                             SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0));
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffffaa0);
                }
                else {
                  local_390 = local_18;
                  local_388 = local_10;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT17(in_stack_fffffffffffffab7,
                                      CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0))
                             ,(char *)in_stack_fffffffffffffaa8);
                  __x_07._M_str = in_stack_fffffffffffffad0;
                  __x_07._M_len = (size_t)in_stack_fffffffffffffac8;
                  __y_07._M_str = (char *)in_stack_fffffffffffffac0;
                  __y_07._M_len = in_stack_fffffffffffffab8;
                  bVar1 = std::operator==(__x_07,__y_07);
                  if (bVar1) {
                    local_3a8 = local_1c.gid;
                    generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__8,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__9>
                              (in_RDI,local_28,local_1c.gid);
                  }
                  else {
                    local_3b8 = local_18;
                    local_3b0 = local_10;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT17(in_stack_fffffffffffffab7,
                                        CONCAT16(in_stack_fffffffffffffab6,in_stack_fffffffffffffab0
                                                )),(char *)in_stack_fffffffffffffaa8);
                    __x_08._M_str = in_stack_fffffffffffffad0;
                    __x_08._M_len = (size_t)in_stack_fffffffffffffac8;
                    __y_08._M_str = (char *)in_stack_fffffffffffffac0;
                    __y_08._M_len = in_stack_fffffffffffffab8;
                    bVar1 = std::operator==(__x_08,__y_08);
                    if (bVar1) {
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
                      std::
                      function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                      ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                    *)in_stack_fffffffffffffaa0,
                                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffa98);
                      std::
                      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                      ::initializer_list(local_3f8);
                      init_03._M_array._6_1_ = in_stack_fffffffffffffab6;
                      init_03._M_array._0_6_ = in_stack_fffffffffffffab0;
                      init_03._M_array._7_1_ = in_stack_fffffffffffffab7;
                      init_03._M_len = in_stack_fffffffffffffab8;
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::array(init_03);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)CONCAT17(in_stack_fffffffffffffab7,
                                              CONCAT16(in_stack_fffffffffffffab6,
                                                       in_stack_fffffffffffffab0)),
                                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffaa8);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)in_stack_fffffffffffffaa0);
                      local_400 = local_28;
                      HandleManager::begin(in_stack_fffffffffffffa98);
                      HandleManager::end(in_stack_fffffffffffffa98);
                      while (bVar1 = CLI::std::operator==(&local_420,&local_440),
                            ((bVar1 ^ 0xffU) & 1) != 0) {
                        this = CLI::std::
                               _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                               ::operator*(&local_420);
                        bVar1 = GlobalFederateId::isValid(&local_1c);
                        if ((((!bVar1) ||
                             (bVar1 = GlobalFederateId::operator==
                                                ((GlobalFederateId *)this,local_1c), bVar1)) &&
                            ((this->handleType == ENDPOINT || (this->handleType == TRANSLATOR)))) &&
                           (bVar1 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x698a10), !bVar1)) {
                          GlobalFederateId::isValid(&local_1c);
                          storeEndpoint(in_RDI,in_stack_fffffffffffffb68,
                                        SUB81((ulong)in_stack_fffffffffffffb60 >> 0x38,0));
                          in_stack_fffffffffffffaa8 = this;
                        }
                        CLI::std::
                        _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                        ::operator++(in_stack_fffffffffffffaa0);
                      }
                      fileops::generateJsonString
                                ((json *)in_stack_fffffffffffffaa8,
                                 SUB81((ulong)in_stack_fffffffffffffaa0 >> 0x38,0));
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)in_stack_fffffffffffffaa0);
                    }
                    else {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_fffffffffffffab7,
                                          CONCAT16(in_stack_fffffffffffffab6,
                                                   in_stack_fffffffffffffab0)),
                                 (char *)in_stack_fffffffffffffaa8);
                      __x_09._M_str = in_stack_fffffffffffffad0;
                      __x_09._M_len = (size_t)in_stack_fffffffffffffac8;
                      __y_09._M_str = (char *)in_stack_fffffffffffffac0;
                      __y_09._M_len = in_stack_fffffffffffffab8;
                      bVar1 = std::operator==(__x_09,__y_09);
                      if (bVar1) {
                        this_00 = (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                   *)&stack0xfffffffffffffb80;
                        generateInterfaceConfig_abi_cxx11_
                                  (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
                        std::
                        function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                        ::operator()(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                              *)in_stack_fffffffffffffa98);
                        fileops::generateJsonString
                                  ((json *)in_stack_fffffffffffffaa8,SUB81((ulong)this_00 >> 0x38,0)
                                  );
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)this_00);
                      }
                      else {
                        std::__cxx11::string::string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffab7,
                                               CONCAT16(in_stack_fffffffffffffab6,
                                                        in_stack_fffffffffffffab0)));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (string *)block;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const HandleManager& handles,
                                          const GlobalFederateId fed,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "inputs") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::INPUT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::INPUT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeInput(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "publications") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::PUBLICATION ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::PUBLICATION ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storePublication(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "filters") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::FILTER && !handle.key.empty());
            });
    }
    if (request == "filter_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["filters"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::FILTER && !handle.key.empty()) {
                storeFilter(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "translators") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty());
            });
    }
    if (request == "translator_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["translators"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty()) {
                storeTranslator(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "endpoints") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::ENDPOINT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::ENDPOINT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeEndpoint(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base = generateInterfaceConfig(handles, fed);
        addHeaderInfo(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}